

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O3

void __thiscall
OStreamTest_CustomArg_Test::~OStreamTest_CustomArg_Test(OStreamTest_CustomArg_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(OStreamTest, CustomArg) {
  fmt::memory_buffer buffer;
  fmt::internal::buffer &base = buffer;
  fmt::format_context ctx(std::back_inserter(base), "", fmt::format_args());
  fmt::format_specs spec;
  test_arg_formatter af(ctx, spec);
  visit(af, fmt::internal::make_arg<fmt::format_context>(TestEnum()));
  EXPECT_EQ("TestEnum", std::string(buffer.data(), buffer.size()));
}